

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimfmt.cpp
# Opt level: O3

void __thiscall
icu_63::DecimalFormat::setMinimumGroupingDigits(DecimalFormat *this,int32_t newValue)

{
  DecimalFormatProperties *pDVar1;
  UErrorCode localStatus;
  undefined8 uStack_8;
  
  pDVar1 = (this->fields->properties).
           super_LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>.ptr;
  if (pDVar1->minimumGroupingDigits != newValue) {
    pDVar1->minimumGroupingDigits = newValue;
    uStack_8 = (ulong)pDVar1 & 0xffffffff;
    touch(this,(UErrorCode *)((long)&uStack_8 + 4));
  }
  return;
}

Assistant:

void DecimalFormat::setMinimumGroupingDigits(int32_t newValue) {
    if (newValue == fields->properties->minimumGroupingDigits) { return; }
    fields->properties->minimumGroupingDigits = newValue;
    touchNoError();
}